

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonChain.cpp
# Opt level: O0

int64_t __thiscall xmrig::JsonChain::getInt64(JsonChain *this,char *key,int64_t defaultValue)

{
  bool bVar1;
  ConstMemberIterator that;
  Pointer pVVar2;
  int64_t iVar3;
  int64_t in_RDX;
  vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
  *in_RDI;
  ConstMemberIterator i;
  const_reverse_iterator it;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_*,_std::vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_38 [3];
  int64_t local_20;
  
  local_20 = in_RDX;
  std::
  vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
  ::rbegin(in_RDI);
  while( true ) {
    std::
    vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
    ::rend(in_RDI);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_*,_std::vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return local_20;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_*,_std::vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>_>_>
    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_*,_std::vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    local_38[0].ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)in_RDI,
                               (Ch *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_*,_std::vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>_>_>
    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_*,_std::vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    that = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)0x1a7844);
    bVar1 = rapidjson::
            GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator!=(local_38,(ConstIterator)that.ptr_);
    in_stack_ffffffffffffffb7 = false;
    if (bVar1) {
      pVVar2 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(local_38);
      in_stack_ffffffffffffffb7 =
           rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::IsInt64(&pVVar2->value);
    }
    if ((bool)in_stack_ffffffffffffffb7 != false) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_*,_std::vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_*,_std::vector<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>_>_>
                  *)(ulong)in_stack_ffffffffffffffb0);
  }
  pVVar2 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->(local_38);
  iVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(&pVVar2->value);
  return iVar3;
}

Assistant:

int64_t xmrig::JsonChain::getInt64(const char *key, int64_t defaultValue) const
{
    for (auto it = m_chain.rbegin(); it != m_chain.rend(); ++it) {
        auto i = it->FindMember(key);
        if (i != it->MemberEnd() && i->value.IsInt64()) {
            return i->value.GetInt64();
        }
    }

    return defaultValue;
}